

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.h
# Opt level: O2

char * __thiscall cppcms::impl::cgi::connection::getenv_abi_cxx11_(connection *this,char *__name)

{
  int iVar1;
  mapped_type *pmVar2;
  allocator local_51;
  key_type local_50;
  
  if ((*(long *)(this + 0xe8) == 0) && (iVar1 = *(int *)(this + 0x38), iVar1 != -1)) {
    for (; iVar1 != -1; iVar1 = *(int *)(*(long *)(this + 0x48) + 0x14 + (long)iVar1 * 0x18)) {
      std::__cxx11::string::string
                ((string *)&local_50,*(char **)(*(long *)(this + 0x48) + (long)iVar1 * 0x18),
                 &local_51);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(this + 0xc0),&local_50);
      std::__cxx11::string::assign((char *)pmVar2);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return (char *)(this + 0xc0);
}

Assistant:

virtual std::map<std::string,std::string> const &getenv()
		{
			if(map_env_.empty() && env_.begin()!=env_.end()) {
				for(string_map::iterator p=env_.begin();p!=env_.end();++p) {
					map_env_[p->key]=p->value;
				}
			}
			return map_env_;
		}